

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralocal.cpp
# Opt level: O0

Error __thiscall
asmjit::v1_14::RALocalAllocator::allocJumpTable
          (RALocalAllocator *this,InstNode *node,RABlocks *targets,RABlock *cont)

{
  RABlock **ppRVar1;
  RASharedAssignment *pRVar2;
  long in_RDX;
  RABlock *in_RSI;
  size_t in_RDI;
  ZoneBitVector *unaff_retaddr;
  PhysToWorkMap *in_stack_00000008;
  RALocalAllocator *in_stack_00000010;
  Error _err_3;
  Error _err_2;
  Error _err_1;
  Error _err;
  RASharedAssignment *sharedAssignment;
  RABlock *anyTarget;
  InstNode *in_stack_00000410;
  RALocalAllocator *in_stack_00000418;
  size_t in_stack_ffffffffffffff10;
  ZoneVector<asmjit::v1_14::RASharedAssignment> *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  RABlock local_b8 [36];
  Error local_94;
  uint *local_90;
  RAAssignment *fromAssignment;
  RABlock *block;
  BaseRAPass *this_00;
  undefined8 in_stack_fffffffffffffff8;
  undefined2 uVar3;
  
  uVar3 = (undefined2)((ulong)in_stack_fffffffffffffff8 >> 0x30);
  block = local_b8;
  if (*(int *)(in_RDX + 8) == 0) {
    local_94 = DebugUtils::errored(3);
  }
  else {
    fromAssignment = *(RAAssignment **)(in_RDI + 8);
    local_90 = *(uint **)in_RSI;
    fromAssignment[5]._physToWorkIds._data[1] = local_90;
    ppRVar1 = ZoneVector<asmjit::v1_14::RABlock_*>::operator[]
                        ((ZoneVector<asmjit::v1_14::RABlock_*> *)in_stack_ffffffffffffff18,
                         in_stack_ffffffffffffff10);
    this_00 = (BaseRAPass *)*ppRVar1;
    if (*(int *)&this_00->field_0xb8 == -1) {
      local_94 = DebugUtils::errored(3);
    }
    else {
      pRVar2 = ZoneVector<asmjit::v1_14::RASharedAssignment>::operator[]
                         (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
      local_94 = allocInst(in_stack_00000418,in_stack_00000410);
      if ((local_94 == 0) &&
         ((pRVar2->_physToWorkMap == (PhysToWorkMap *)0x0 ||
          (local_94 = switchToAssignment(in_stack_00000010,in_stack_00000008,unaff_retaddr,
                                         SUB21((ushort)uVar3 >> 8,0),SUB21(uVar3,0)), local_94 == 0)
          ))) {
        if (*(int *)&this_00->field_0xb8 != -1) {
          ZoneVector<asmjit::v1_14::RASharedAssignment>::operator[]
                    ((ZoneVector<asmjit::v1_14::RASharedAssignment> *)this_00,in_RDI);
        }
        local_94 = spillScratchGpRegsBeforeEntry
                             ((RALocalAllocator *)
                              CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                              (RegMask)(in_RDI >> 0x20));
        if ((local_94 == 0) &&
           ((pRVar2->_physToWorkMap != (PhysToWorkMap *)0x0 ||
            (local_94 = BaseRAPass::setBlockEntryAssignment(this_00,block,in_RSI,fromAssignment),
            local_94 == 0)))) {
          local_94 = 0;
        }
      }
    }
  }
  return local_94;
}

Assistant:

Error RALocalAllocator::allocJumpTable(InstNode* node, const RABlocks& targets, RABlock* cont) noexcept {
  // TODO: Do we really need to use `cont`?
  DebugUtils::unused(cont);

  if (targets.empty())
    return DebugUtils::errored(kErrorInvalidState);

  // The cursor must point to the previous instruction for a possible instruction insertion.
  _cc->_setCursor(node->prev());

  // All `targets` should have the same sharedAssignmentId, we just read the first.
  RABlock* anyTarget = targets[0];
  if (!anyTarget->hasSharedAssignmentId())
    return DebugUtils::errored(kErrorInvalidState);

  RASharedAssignment& sharedAssignment = _pass->_sharedAssignments[anyTarget->sharedAssignmentId()];

  ASMJIT_PROPAGATE(allocInst(node));

  if (!sharedAssignment.empty()) {
    ASMJIT_PROPAGATE(switchToAssignment(
      sharedAssignment.physToWorkMap(),
      sharedAssignment.liveIn(),
      true,  // Read-only.
      false  // Try-mode.
    ));
  }

  ASMJIT_PROPAGATE(spillRegsBeforeEntry(anyTarget));

  if (sharedAssignment.empty()) {
    ASMJIT_PROPAGATE(_pass->setBlockEntryAssignment(anyTarget, block(), _curAssignment));
  }

  return kErrorOk;
}